

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O3

int secp256k1_musig_aggnonce_parse
              (secp256k1_context *ctx,secp256k1_musig_aggnonce *nonce,uchar *in66)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  uchar *p2;
  bool bVar4;
  long lVar5;
  secp256k1_ge *psVar6;
  uchar *buf;
  secp256k1_ge ges [2];
  uchar local_108 [48];
  secp256k1_ge local_d8;
  secp256k1_ge local_80;
  
  if ((nonce == (secp256k1_musig_aggnonce *)0x0) || (in66 == (uchar *)0x0)) {
    secp256k1_musig_aggnonce_parse_cold_1();
LAB_00110630:
    iVar2 = 0;
  }
  else {
    lVar5 = 0;
    psVar6 = &local_d8;
    bVar1 = true;
    do {
      bVar4 = bVar1;
      local_108[0x10] = '\0';
      local_108[0x11] = '\0';
      local_108[0x12] = '\0';
      local_108[0x13] = '\0';
      local_108[0x14] = '\0';
      local_108[0x15] = '\0';
      local_108[0x16] = '\0';
      local_108[0x17] = '\0';
      local_108[0x18] = '\0';
      local_108[0x19] = '\0';
      local_108[0x1a] = '\0';
      local_108[0x1b] = '\0';
      local_108[0x1c] = '\0';
      local_108[0x1d] = '\0';
      local_108[0x1e] = '\0';
      local_108[0x1f] = '\0';
      local_108[0] = '\0';
      local_108[1] = '\0';
      local_108[2] = '\0';
      local_108[3] = '\0';
      local_108[4] = '\0';
      local_108[5] = '\0';
      local_108[6] = '\0';
      local_108[7] = '\0';
      local_108[8] = '\0';
      local_108[9] = '\0';
      local_108[10] = '\0';
      local_108[0xb] = '\0';
      local_108[0xc] = '\0';
      local_108[0xd] = '\0';
      local_108[0xe] = '\0';
      local_108[0xf] = '\0';
      local_108[0x20] = 0;
      lVar3 = 0;
      do {
        if ((in66 + lVar5)[lVar3] != local_108[lVar3]) {
          iVar2 = secp256k1_eckey_pubkey_parse(psVar6,in66 + lVar5,0x21);
          if (iVar2 == 0) goto LAB_00110630;
          goto LAB_001105b9;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x21);
      psVar6->infinity = 1;
      (psVar6->x).n[0] = 0;
      (psVar6->x).n[1] = 0;
      (psVar6->x).n[2] = 0;
      (psVar6->x).n[3] = 0;
      (psVar6->x).n[4] = 0;
      (psVar6->y).n[0] = 0;
      (psVar6->y).n[1] = 0;
      (psVar6->y).n[2] = 0;
      (psVar6->y).n[3] = 0;
      (psVar6->y).n[4] = 0;
LAB_001105b9:
      lVar5 = 0x21;
      psVar6 = &local_80;
      bVar1 = false;
    } while (bVar4);
    nonce->data[0] = 0xa8;
    nonce->data[1] = 0xb7;
    nonce->data[2] = 0xe4;
    nonce->data[3] = 'g';
    lVar5 = 4;
    psVar6 = &local_d8;
    bVar1 = true;
    do {
      bVar4 = bVar1;
      buf = nonce->data + lVar5;
      if (psVar6->infinity == 0) {
        secp256k1_ge_to_bytes(buf,psVar6);
      }
      else {
        buf[0x30] = '\0';
        buf[0x31] = '\0';
        buf[0x32] = '\0';
        buf[0x33] = '\0';
        buf[0x34] = '\0';
        buf[0x35] = '\0';
        buf[0x36] = '\0';
        buf[0x37] = '\0';
        buf[0x38] = '\0';
        buf[0x39] = '\0';
        buf[0x3a] = '\0';
        buf[0x3b] = '\0';
        buf[0x3c] = '\0';
        buf[0x3d] = '\0';
        buf[0x3e] = '\0';
        buf[0x3f] = '\0';
        buf[0x20] = '\0';
        buf[0x21] = '\0';
        buf[0x22] = '\0';
        buf[0x23] = '\0';
        buf[0x24] = '\0';
        buf[0x25] = '\0';
        buf[0x26] = '\0';
        buf[0x27] = '\0';
        buf[0x28] = '\0';
        buf[0x29] = '\0';
        buf[0x2a] = '\0';
        buf[0x2b] = '\0';
        buf[0x2c] = '\0';
        buf[0x2d] = '\0';
        buf[0x2e] = '\0';
        buf[0x2f] = '\0';
        buf[0x10] = '\0';
        buf[0x11] = '\0';
        buf[0x12] = '\0';
        buf[0x13] = '\0';
        buf[0x14] = '\0';
        buf[0x15] = '\0';
        buf[0x16] = '\0';
        buf[0x17] = '\0';
        buf[0x18] = '\0';
        buf[0x19] = '\0';
        buf[0x1a] = '\0';
        buf[0x1b] = '\0';
        buf[0x1c] = '\0';
        buf[0x1d] = '\0';
        buf[0x1e] = '\0';
        buf[0x1f] = '\0';
        buf[0] = '\0';
        buf[1] = '\0';
        buf[2] = '\0';
        buf[3] = '\0';
        buf[4] = '\0';
        buf[5] = '\0';
        buf[6] = '\0';
        buf[7] = '\0';
        buf[8] = '\0';
        buf[9] = '\0';
        buf[10] = '\0';
        buf[0xb] = '\0';
        buf[0xc] = '\0';
        buf[0xd] = '\0';
        buf[0xe] = '\0';
        buf[0xf] = '\0';
      }
      lVar5 = 0x44;
      psVar6 = &local_80;
      bVar1 = false;
    } while (bVar4);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int secp256k1_musig_aggnonce_parse(const secp256k1_context* ctx, secp256k1_musig_aggnonce* nonce, const unsigned char *in66) {
    secp256k1_ge ges[2];
    int i;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(nonce != NULL);
    ARG_CHECK(in66 != NULL);

    for (i = 0; i < 2; i++) {
        if (!secp256k1_musig_ge_parse_ext(&ges[i], &in66[33*i])) {
            return 0;
        }
    }
    secp256k1_musig_aggnonce_save(nonce, ges);
    return 1;
}